

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::CommandLineInterface::EncodeOrDecode
          (CommandLineInterface *this,DescriptorPool *pool)

{
  bool bVar1;
  Descriptor *type;
  Message *this_00;
  MessageLite *this_01;
  ostream *poVar2;
  bool bVar3;
  char *pcVar4;
  string_view name;
  ErrorPrinter error_collector;
  Parser parser;
  FileOutputStream out;
  FileInputStream in;
  DynamicMessageFactory dynamic_factory;
  
  name._M_str = (this->codec_type_)._M_dataplus._M_p;
  name._M_len = (this->codec_type_)._M_string_length;
  type = DescriptorPool::FindMessageTypeByName(pool,name);
  if (type == (Descriptor *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Type not defined: ");
    poVar2 = std::operator<<(poVar2,(string *)&this->codec_type_);
    std::endl<char,std::char_traits<char>>(poVar2);
    return false;
  }
  DynamicMessageFactory::DynamicMessageFactory(&dynamic_factory,pool);
  this_00 = DynamicMessageFactory::GetPrototype(&dynamic_factory,type);
  this_01 = &Message::New(this_00)->super_MessageLite;
  io::FileInputStream::FileInputStream(&in,0,-1);
  io::FileOutputStream::FileOutputStream(&out,1,-1);
  if (this->mode_ == MODE_ENCODE) {
    error_collector.format_ = this->error_format_;
    error_collector.super_MultiFileErrorCollector._vptr_MultiFileErrorCollector =
         (_func_int **)&PTR__ErrorPrinter_00792ed0;
    error_collector.super_ErrorCollector._vptr_ErrorCollector =
         (_func_int **)&PTR__ErrorPrinter_00792f20;
    error_collector.super_ErrorCollector._vptr_ErrorCollector =
         (_func_int **)&PTR__ErrorPrinter_00792f50;
    error_collector.tree_ = (DiskSourceTree *)0x0;
    error_collector.found_errors_ = false;
    error_collector.found_warnings_ = false;
    TextFormat::Parser::Parser(&parser);
    parser.error_collector_ = &error_collector.super_ErrorCollector;
    parser.allow_partial_ = true;
    bVar1 = TextFormat::Parser::Parse(&parser,&in.super_ZeroCopyInputStream,(Message *)this_01);
    if (bVar1) {
      TextFormat::Parser::~Parser(&parser);
      ErrorPrinter::~ErrorPrinter(&error_collector);
LAB_0013c796:
      bVar1 = MessageLite::IsInitialized(this_01);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "warning:  Input message is missing required fields:  ");
        Message::InitializationErrorString_abi_cxx11_((string *)&error_collector,(Message *)this_01)
        ;
        poVar2 = std::operator<<(poVar2,(string *)&error_collector);
        std::endl<char,std::char_traits<char>>(poVar2);
        std::__cxx11::string::~string((string *)&error_collector);
      }
      if (this->mode_ != MODE_ENCODE) {
        bVar1 = TextFormat::Print((Message *)this_01,(ZeroCopyOutputStream *)&out);
        bVar3 = true;
        if (bVar1) goto LAB_0013c8b2;
        pcVar4 = "output: I/O error.";
        goto LAB_0013c877;
      }
      io::CodedOutputStream::CodedOutputStream<google::protobuf::io::FileOutputStream,void>
                ((CodedOutputStream *)&error_collector,&out);
      bVar1 = MessageLite::SerializePartialToCodedStream
                        (this_01,(CodedOutputStream *)&error_collector);
      if (bVar1) {
        io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&error_collector);
        bVar3 = true;
        goto LAB_0013c8b2;
      }
      poVar2 = std::operator<<((ostream *)&std::cerr,"output: I/O error.");
      std::endl<char,std::char_traits<char>>(poVar2);
      io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&error_collector);
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Failed to parse input.");
      std::endl<char,std::char_traits<char>>(poVar2);
      TextFormat::Parser::~Parser(&parser);
      ErrorPrinter::~ErrorPrinter(&error_collector);
    }
  }
  else {
    bVar1 = MessageLite::ParsePartialFromZeroCopyStream(this_01,&in.super_ZeroCopyInputStream);
    if (bVar1) goto LAB_0013c796;
    pcVar4 = "Failed to parse input.";
LAB_0013c877:
    poVar2 = std::operator<<((ostream *)&std::cerr,pcVar4);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  bVar3 = false;
LAB_0013c8b2:
  io::FileOutputStream::~FileOutputStream(&out);
  io::FileInputStream::~FileInputStream(&in);
  if (this_01 != (MessageLite *)0x0) {
    (*this_01->_vptr_MessageLite[1])(this_01);
  }
  DynamicMessageFactory::~DynamicMessageFactory(&dynamic_factory);
  return bVar3;
}

Assistant:

bool CommandLineInterface::EncodeOrDecode(const DescriptorPool* pool) {
  // Look up the type.
  const Descriptor* type = pool->FindMessageTypeByName(codec_type_);
  if (type == nullptr) {
    std::cerr << "Type not defined: " << codec_type_ << std::endl;
    return false;
  }

  DynamicMessageFactory dynamic_factory(pool);
  std::unique_ptr<Message> message(dynamic_factory.GetPrototype(type)->New());

  if (mode_ == MODE_ENCODE) {
    SetFdToTextMode(STDIN_FILENO);
    SetFdToBinaryMode(STDOUT_FILENO);
  } else {
    SetFdToBinaryMode(STDIN_FILENO);
    SetFdToTextMode(STDOUT_FILENO);
  }

  io::FileInputStream in(STDIN_FILENO);
  io::FileOutputStream out(STDOUT_FILENO);

  if (mode_ == MODE_ENCODE) {
    // Input is text.
    ErrorPrinter error_collector(error_format_);
    TextFormat::Parser parser;
    parser.RecordErrorsTo(&error_collector);
    parser.AllowPartialMessage(true);

    if (!parser.Parse(&in, message.get())) {
      std::cerr << "Failed to parse input." << std::endl;
      return false;
    }
  } else {
    // Input is binary.
    if (!message->ParsePartialFromZeroCopyStream(&in)) {
      std::cerr << "Failed to parse input." << std::endl;
      return false;
    }
  }

  if (!message->IsInitialized()) {
    std::cerr << "warning:  Input message is missing required fields:  "
              << message->InitializationErrorString() << std::endl;
  }

  if (mode_ == MODE_ENCODE) {
    // Output is binary.
    io::CodedOutputStream coded_out(&out);
    coded_out.SetSerializationDeterministic(deterministic_output_);
    if (!message->SerializePartialToCodedStream(&coded_out)) {
      std::cerr << "output: I/O error." << std::endl;
      return false;
    }
  } else {
    // Output is text.
    if (!TextFormat::Print(*message, &out)) {
      std::cerr << "output: I/O error." << std::endl;
      return false;
    }
  }

  return true;
}